

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void do_cmd_view_map(void)

{
  int iVar1;
  level_conflict *plVar2;
  char *str;
  int iVar3;
  wchar_t wVar4;
  size_t sVar5;
  ui_event uVar6;
  wchar_t local_c8;
  keycode_t local_c4;
  wchar_t local_c0;
  wchar_t local_bc;
  level_conflict *local_70;
  level *west;
  level *south;
  level *east;
  level *north;
  level *lev;
  ui_event ke;
  wchar_t next_place;
  wchar_t centre_place;
  wchar_t num;
  wchar_t num_across;
  wchar_t num_down;
  wchar_t hgt;
  wchar_t wid;
  char *prompt;
  wchar_t local_10;
  uint8_t h;
  wchar_t wStack_c;
  uint8_t w;
  wchar_t cx;
  wchar_t cy;
  
  _hgt = "Hit any key to continue";
  Term_get_size(&num_down,&num_across);
  screen_save();
  prt("Please wait...",L'\0',L'\0');
  Term_fresh();
  Term_clear();
  prompt._7_1_ = tile_width;
  prompt._6_1_ = tile_height;
  tile_width = '\x01';
  tile_height = '\x01';
  display_map(&stack0xfffffffffffffff4,&local_10);
  str = _hgt;
  iVar3 = Term->hgt;
  iVar1 = Term->wid;
  sVar5 = strlen(_hgt);
  put_str(str,iVar3 + L'\xffffffff',iVar1 / 2 - (int)(sVar5 >> 1));
  Term_gotoxy(local_10,wStack_c);
  anykey();
  tile_width = prompt._7_1_;
  tile_height = prompt._6_1_;
  iVar3 = strcmp(world->name,"Hybrid Dungeon");
  if (((iVar3 != 0) && (iVar3 = strcmp(world->name,"Angband Dungeon"), iVar3 != 0)) &&
     (wVar4 = level_topography((int)player->place), wVar4 != L'\a')) {
    ke._8_4_ = SEXT24(player->place);
    while( true ) {
      plVar2 = world->levels;
      east = (level *)0x0;
      south = (level *)0x0;
      west = (level *)0x0;
      local_70 = (level_conflict *)0x0;
      if (plVar2[(int)ke._8_4_].north != (char *)0x0) {
        east = (level *)level_by_name(world,plVar2[(int)ke._8_4_].north);
      }
      if (plVar2[(int)ke._8_4_].east != (char *)0x0) {
        south = (level *)level_by_name(world,plVar2[(int)ke._8_4_].east);
      }
      if (plVar2[(int)ke._8_4_].south != (char *)0x0) {
        west = (level *)level_by_name(world,plVar2[(int)ke._8_4_].south);
      }
      if (plVar2[(int)ke._8_4_].west != (char *)0x0) {
        local_70 = level_by_name(world,plVar2[(int)ke._8_4_].west);
      }
      Term_fresh();
      Term_clear();
      regional_map(L'\x02',ke._8_4_);
      put_str("Move keys to scroll, other input to continue",num_across + L'\xffffffff',
              (num_down + L'\xffffffd8') - (num_down + L'\xffffffd8' >> 0x1f) >> 1);
      uVar6 = inkey_ex();
      ke.key.code = 0xffffffff;
      lev._4_4_ = uVar6.key.code;
      switch(lev._4_4_) {
      case 0x68:
      case 0x81:
        if (local_70 == (level_conflict *)0x0) {
          local_c4 = 0;
        }
        else {
          local_c4 = local_70->index;
        }
        ke.key.code = local_c4;
        break;
      case 0x6a:
      case 0x80:
        if (west == (level *)0x0) {
          local_c0 = L'\0';
        }
        else {
          local_c0 = west->index;
        }
        ke.key.code = local_c0;
        break;
      case 0x6b:
      case 0x83:
        if (east == (level *)0x0) {
          local_bc = L'\0';
        }
        else {
          local_bc = east->index;
        }
        ke.key.code = local_bc;
        break;
      case 0x6c:
      case 0x82:
        if (south == (level *)0x0) {
          local_c8 = L'\0';
        }
        else {
          local_c8 = south->index;
        }
        ke.key.code = local_c8;
      }
      if (ke.key.code == 0xffffffff) break;
      if (ke.key.code != 0) {
        ke._8_4_ = ke.key.code;
      }
    }
  }
  screen_load();
  return;
}

Assistant:

void do_cmd_view_map(void)
{
	int cy, cx;
	uint8_t w, h;
	const char *prompt = "Hit any key to continue";
	/* variables for regional map */
	int wid, hgt;
	int num_down, num_across, num, centre_place, next_place;
	ui_event ke;

	//if (Term->view_map_hook) {
	//	(*(Term->view_map_hook))(Term);
	//	return;
	//}

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Get dimensions for the regional map */
	num_down = (hgt - 6) / 8;
	num_across = (wid - 24) / 20;
	num = (num_down < num_across ? num_down : num_across);

	/* Hack - limit range for now */
	num = 2;

	/* Save screen */
	screen_save();

	/* Note */
	prt("Please wait...", 0, 0);

	/* Flush */
	Term_fresh();

	/* Clear the screen */
	Term_clear();

	/* store the tile multipliers */
	w = tile_width;
	h = tile_height;
	tile_width = 1;
	tile_height = 1;

	/* Display the map */
	display_map(&cy, &cx);

	/* Show the prompt */
	put_str(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	/* Highlight the player */
	Term_gotoxy(cx, cy);

	/* Get any key */
	(void)anykey();

	/* Restore the tile multipliers */
	tile_width = w;
	tile_height = h;

	/* Show regional map only if there is wilderness */
	if (!streq(world->name, "Hybrid Dungeon") &&
		!streq(world->name, "Angband Dungeon") &&
		(level_topography(player->place) != TOP_CAVE)) {
		centre_place = player->place;
		while (true) {
			/* Get the adjacent levels */
			struct level *lev = &world->levels[centre_place];
			struct level *north = NULL;
			struct level *east = NULL;
			struct level *south = NULL;
			struct level *west = NULL;
			if (lev->north) north = level_by_name(world, lev->north);
			if (lev->east) east = level_by_name(world, lev->east);
			if (lev->south) south = level_by_name(world, lev->south);
			if (lev->west) west = level_by_name(world, lev->west);

			/* Flush */
			Term_fresh();

			/* Clear the screen */
			Term_clear();

			/* Display the regional map */
			regional_map(num, centre_place);

			/* Wait for it */
			put_str("Move keys to scroll, other input to continue",
					hgt - 1, (wid - 40) / 2);

			/* Get any key */
			ke = inkey_ex();
			next_place = -1;
			switch (ke.key.code) {
			case 'k':
			case ARROW_UP:
				next_place = north ? north->index : 0;
				break;
			case 'j':
			case ARROW_DOWN:
				next_place = south ? south->index : 0;
				break;
			case 'h':
			case ARROW_LEFT:
				next_place = west ? west->index : 0;
				break;
			case 'l':
			case ARROW_RIGHT:
				next_place = east ? east->index : 0;
				break;
			}
			if (next_place == -1)
				break;
			if (next_place)
				centre_place = next_place;
		}
	}

	/* Load screen */
	screen_load();
}